

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O0

void __thiscall
QPixmapStyle::drawComplexControl
          (QPixmapStyle *this,ComplexControl cc,QStyleOptionComplex *option,QPainter *painter,
          QWidget *widget)

{
  QWidget *in_RCX;
  QPainter *in_RDX;
  int in_ESI;
  QPixmapStyle *in_RDI;
  QWidget *unaff_retaddr;
  QPainter *in_stack_00000008;
  undefined4 in_stack_00000028;
  QStyleOptionComplex *in_stack_00000038;
  QPixmapStyle *in_stack_00000040;
  QWidget *in_stack_00000430;
  QPainter *in_stack_00000438;
  QStyleOptionComplex *in_stack_00000440;
  ComplexControl in_stack_0000044c;
  QCommonStyle *in_stack_00000450;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI == 1) {
    drawComboBox((QPixmapStyle *)painter,(QStyleOptionComplex *)widget,in_stack_00000008,
                 unaff_retaddr);
  }
  else if (in_ESI == 2) {
    drawScrollBar(in_RDI,(QStyleOptionComplex *)CONCAT44(2,in_stack_fffffffffffffff0),in_RDX,in_RCX)
    ;
  }
  else if (in_ESI == 3) {
    drawSlider(in_stack_00000040,in_stack_00000038,(QPainter *)this,
               (QWidget *)CONCAT44(cc,in_stack_00000028));
  }
  else {
    QCommonStyle::drawComplexControl
              (in_stack_00000450,in_stack_0000044c,in_stack_00000440,in_stack_00000438,
               in_stack_00000430);
  }
  return;
}

Assistant:

void QPixmapStyle::drawComplexControl(ComplexControl cc, const QStyleOptionComplex *option,
                                      QPainter *painter, const QWidget *widget) const
{
    switch (cc) {
    case CC_Slider:
        drawSlider(option, painter, widget);
        break;
    case CC_ComboBox:
        drawComboBox(option, painter, widget);
        break;
    case CC_ScrollBar:
        drawScrollBar(option, painter, widget);
        break;
    default:
        QCommonStyle::drawComplexControl(cc, option, painter, widget);
    }
}